

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O2

void __thiscall Imf_3_2::AcesInputFile::Data::initColorConversion(Data *this)

{
  V2f VVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  Header *header;
  Chromaticities *pCVar4;
  V2f *pVVar5;
  Box2i *pBVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  V3f acesNeutralXYZ;
  V3f fileNeutralXYZ;
  M44f bradfordTrans;
  undefined1 local_248 [20];
  float fStack_234;
  V2f VStack_230;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [32];
  Vec3<float> local_1c8;
  Vec3<float> local_1bc;
  Matrix44<float> local_1b0;
  Matrix44<float> local_170;
  Matrix44<float> local_130;
  Matrix44<float> local_f0;
  M44f local_b0;
  M44f local_70;
  
  header = RgbaInputFile::header(this->rgbaFile);
  local_130.x[0][0] = 0.64;
  local_130.x[0][1] = 0.33;
  local_170.x[0][0] = 0.3;
  local_170.x[0][1] = 0.6;
  local_1b0.x[0][0] = 0.15;
  local_1b0.x[0][1] = 0.06;
  local_f0.x[0][0] = 0.3127;
  local_f0.x[0][1] = 0.329;
  Chromaticities::Chromaticities
            ((Chromaticities *)local_248,(V2f *)&local_130,(V2f *)&local_170,(V2f *)&local_1b0,
             (V2f *)&local_f0);
  bVar3 = hasChromaticities(header);
  if (bVar3) {
    pCVar4 = chromaticities(header);
    local_248._0_8_ = pCVar4->red;
    local_248._8_8_ = pCVar4->green;
    local_248._16_4_ = (pCVar4->blue).x;
    fStack_234 = (pCVar4->blue).y;
    VStack_230.x = (pCVar4->white).x;
    VStack_230.y = (pCVar4->white).y;
    local_228._4_4_ = (undefined4)((ulong)VStack_230 >> 0x20);
    local_218._8_4_ = VStack_230.x;
    local_218._0_8_ = VStack_230;
    local_218._12_4_ = local_228._4_4_;
    local_228._0_4_ = local_228._4_4_;
    fStack_220 = (float)local_228._4_4_;
    fStack_21c = (float)local_228._4_4_;
  }
  else {
    local_218 = ZEXT416((uint)VStack_230.x);
    _local_228 = ZEXT416((uint)VStack_230.y);
  }
  bVar3 = hasAdoptedNeutral(header);
  if (bVar3) {
    pVVar5 = adoptedNeutral(header);
    VVar1 = *pVVar5;
    local_228._4_4_ = VVar1.y;
    VStack_230.x = VVar1.x;
    VStack_230.y = VVar1.y;
    local_218._8_8_ = 0;
    local_218._0_4_ = VVar1.x;
    local_218._4_4_ = VVar1.y;
    local_228._0_4_ = local_228._4_4_;
    fStack_220 = (float)local_228._4_4_;
    fStack_21c = (float)local_228._4_4_;
  }
  acesChromaticities();
  auVar2 = (undefined1  [16])acesChromaticities::acesChr._16_16_;
  local_1e8._0_4_ = acesChromaticities::acesChr.red.x;
  local_1e8._4_4_ = acesChromaticities::acesChr.red.y;
  local_1e8._8_4_ = acesChromaticities::acesChr.green.x;
  local_1e8._12_4_ = acesChromaticities::acesChr.green.y;
  fVar7 = acesChromaticities::acesChr.blue.x;
  fVar8 = acesChromaticities::acesChr.blue.y;
  fVar9 = acesChromaticities::acesChr.white.x;
  local_1f8 = acesChromaticities::acesChr.white.y;
  local_1e8._16_4_ = acesChromaticities::acesChr.blue.x;
  local_1e8._20_4_ = acesChromaticities::acesChr.blue.y;
  local_1e8._24_4_ = acesChromaticities::acesChr.white.x;
  local_1e8._28_4_ = acesChromaticities::acesChr.white.y;
  if (((float)local_248._0_4_ == acesChromaticities::acesChr.red.x) &&
     (!NAN((float)local_248._0_4_) && !NAN(acesChromaticities::acesChr.red.x))) {
    if (((float)local_248._4_4_ == acesChromaticities::acesChr.red.y) &&
       (!NAN((float)local_248._4_4_) && !NAN(acesChromaticities::acesChr.red.y))) {
      if (((float)local_248._8_4_ == acesChromaticities::acesChr.green.x) &&
         (!NAN((float)local_248._8_4_) && !NAN(acesChromaticities::acesChr.green.x))) {
        if (((float)local_248._12_4_ == acesChromaticities::acesChr.green.y) &&
           (!NAN((float)local_248._12_4_) && !NAN(acesChromaticities::acesChr.green.y))) {
          if (((float)local_248._16_4_ == fVar7) && (!NAN((float)local_248._16_4_) && !NAN(fVar7)))
          {
            if ((fStack_234 == fVar8) && (!NAN(fStack_234) && !NAN(fVar8))) {
              if ((VStack_230.x == fVar9) && (!NAN(VStack_230.x) && !NAN(fVar9))) {
                if ((VStack_230.y == local_1f8) && (!NAN(VStack_230.y) && !NAN(local_1f8))) {
                  acesChromaticities::acesChr._16_16_ = auVar2;
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  acesChromaticities::acesChr._16_16_ = auVar2;
  this->mustConvertColor = true;
  local_208._8_4_ = fVar9;
  local_208._0_4_ = auVar2._8_8_.x;
  local_208._4_4_ = auVar2._8_8_.y;
  local_208._12_4_ = local_1f8;
  fStack_1f4 = local_1f8;
  fStack_1f0 = local_1f8;
  fStack_1ec = local_1f8;
  pBVar6 = Header::dataWindow(header);
  this->minX = (pBVar6->min).x;
  pBVar6 = Header::dataWindow(header);
  this->maxX = (pBVar6->max).x;
  local_1bc.x = (float)local_218._0_4_ / (float)local_228._0_4_;
  local_1bc.z = ((1.0 - (float)local_218._0_4_) - (float)local_228._0_4_) / (float)local_228._0_4_;
  local_1bc.y = 1.0;
  local_1c8.x = (float)local_208._0_4_ / local_1f8;
  local_1c8.z = ((1.0 - (float)local_208._0_4_) - local_1f8) / local_1f8;
  local_1c8.y = 1.0;
  Imath_3_2::operator*(&local_1c8,&initColorConversion::bradfordCPM);
  Imath_3_2::operator*(&local_1bc,&initColorConversion::bradfordCPM);
  local_130.x[0][0] = local_130.x[0][0] / local_170.x[0][0];
  local_130.x[1][1] = local_130.x[0][1] / local_170.x[0][1];
  local_130.x[2][2] = local_130.x[0][2] / local_170.x[0][2];
  local_130.x[0][1] = 0.0;
  local_130.x[0][2] = 0.0;
  local_130.x[0][3] = 0.0;
  local_130.x[1][0] = 0.0;
  local_130.x[1][2] = 0.0;
  local_130.x[1][3] = 0.0;
  local_130.x[2][0] = 0.0;
  local_130.x[2][1] = 0.0;
  local_130.x[2][3] = 0.0;
  local_130.x[3][0] = 0.0;
  local_130.x[3][1] = 0.0;
  local_130.x[3][2] = 0.0;
  local_130.x[3][3] = 1.0;
  Imath_3_2::Matrix44<float>::multiply(&initColorConversion::bradfordCPM,&local_130);
  Imath_3_2::Matrix44<float>::multiply(&local_1b0,&initColorConversion::inverseBradfordCPM);
  RGBtoXYZ(&local_70,(Chromaticities *)local_248,1.0);
  Imath_3_2::Matrix44<float>::multiply(&local_70,&local_170);
  XYZtoRGB(&local_b0,(Chromaticities *)local_1e8,1.0);
  Imath_3_2::Matrix44<float>::multiply(&local_f0,&local_b0);
  Imath_3_2::Matrix44<float>::operator=(&this->fileToAces,&local_1b0);
  return;
}

Assistant:

void
AcesInputFile::Data::initColorConversion ()
{
    const Header& header = rgbaFile->header ();

    Chromaticities fileChr;

    if (hasChromaticities (header)) fileChr = chromaticities (header);

    V2f fileNeutral = fileChr.white;

    if (hasAdoptedNeutral (header))
    {
        fileNeutral   = adoptedNeutral (header);
        fileChr.white = fileNeutral; // for RGBtoXYZ() purposes.
    }

    const Chromaticities acesChr = acesChromaticities ();

    V2f acesNeutral = acesChr.white;

    if (fileChr.red == acesChr.red && fileChr.green == acesChr.green &&
        fileChr.blue == acesChr.blue && fileChr.white == acesChr.white)
    {
        //
        // The file already contains ACES data,
        // color conversion is not necessary.

        return;
    }

    mustConvertColor = true;
    minX             = header.dataWindow ().min.x;
    maxX             = header.dataWindow ().max.x;

    //
    // Create a matrix that transforms colors from the
    // RGB space of the input file into the ACES space
    // using a color adaptation transform to move the
    // white point.
    //

    //
    // We'll need the Bradford cone primary matrix and its inverse
    //

    static const M44f bradfordCPM (
        0.895100f,
        -0.750200f,
        0.038900f,
        0.000000f,
        0.266400f,
        1.713500f,
        -0.068500f,
        0.000000f,
        -0.161400f,
        0.036700f,
        1.029600f,
        0.000000f,
        0.000000f,
        0.000000f,
        0.000000f,
        1.000000f);

    const static M44f inverseBradfordCPM (
        0.986993f,
        0.432305f,
        -0.008529f,
        0.000000f,
        -0.147054f,
        0.518360f,
        0.040043f,
        0.000000f,
        0.159963f,
        0.049291f,
        0.968487f,
        0.000000f,
        0.000000f,
        0.000000f,
        0.000000f,
        1.000000f);

    //
    // Convert the white points of the two RGB spaces to XYZ
    //

    float fx = fileNeutral.x;
    float fy = fileNeutral.y;
    V3f   fileNeutralXYZ (fx / fy, 1, (1 - fx - fy) / fy);

    float ax = acesNeutral.x;
    float ay = acesNeutral.y;
    V3f   acesNeutralXYZ (ax / ay, 1, (1 - ax - ay) / ay);

    //
    // Compute the Bradford transformation matrix
    //

    V3f ratio ((acesNeutralXYZ * bradfordCPM) / (fileNeutralXYZ * bradfordCPM));

    M44f ratioMat (
        ratio[0], 0, 0, 0, 0, ratio[1], 0, 0, 0, 0, ratio[2], 0, 0, 0, 0, 1);

    M44f bradfordTrans = bradfordCPM * ratioMat * inverseBradfordCPM;

    //
    // Build a combined file-RGB-to-ACES-RGB conversion matrix
    //

    fileToAces = RGBtoXYZ (fileChr, 1) * bradfordTrans * XYZtoRGB (acesChr, 1);
}